

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::calcCubemapFaceCoords
               (Vec3 *r,Vec3 *drdx,Vec3 *drdy,int faceNdx,Vec2 *coordFace,Vec2 *dPdxFace,
               Vec2 *dPdyFace)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int ndx;
  int iVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int local_6c;
  int compNdx_1;
  int mappedSign;
  int mappedComp;
  int compNdx;
  Vec3 dPcdy;
  Vec3 dPcdx;
  Vec3 coordC;
  Vec2 *dPdxFace_local;
  Vec2 *coordFace_local;
  int faceNdx_local;
  Vec3 *drdy_local;
  Vec3 *drdx_local;
  Vec3 *r_local;
  
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(dPcdx.m_data + 1));
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(dPcdy.m_data + 1));
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&mappedComp);
  for (mappedSign = 0; mappedSign < 3; mappedSign = mappedSign + 1) {
    ndx = calcCubemapFaceCoords::compMap[faceNdx][mappedSign];
    iVar4 = calcCubemapFaceCoords::signMap[faceNdx][mappedSign];
    pfVar5 = tcu::Vector<float,_3>::operator[](r,ndx);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),mappedSign);
    *pfVar5 = fVar6 * (float)iVar4;
    pfVar5 = tcu::Vector<float,_3>::operator[](drdx,ndx);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdy.m_data + 1),mappedSign);
    *pfVar5 = fVar6 * (float)iVar4;
    pfVar5 = tcu::Vector<float,_3>::operator[](drdy,ndx);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)&mappedComp,mappedSign);
    *pfVar5 = fVar6 * (float)iVar4;
  }
  pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
  fVar6 = de::abs<float>(*pfVar5);
  pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
  *pfVar5 = fVar6;
  for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),local_6c);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar7 = de::abs<float>(*pfVar5);
    pfVar5 = tcu::Vector<float,_2>::operator[](coordFace,local_6c);
    *pfVar5 = (fVar6 * 0.5) / fVar7 + 0.5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar8 = de::abs<float>(*pfVar5);
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdy.m_data + 1),local_6c);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),local_6c);
    fVar7 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdy.m_data + 1),2);
    fVar1 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar2 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar3 = *pfVar5;
    pfVar5 = tcu::Vector<float,_2>::operator[](dPdxFace,local_6c);
    *pfVar5 = ((fVar8 * fVar6 + -(fVar7 * fVar1)) * 0.5) / (fVar2 * fVar3);
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar8 = de::abs<float>(*pfVar5);
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)&mappedComp,local_6c);
    fVar6 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),local_6c);
    fVar7 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)&mappedComp,2);
    fVar1 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar2 = *pfVar5;
    pfVar5 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)(dPcdx.m_data + 1),2);
    fVar3 = *pfVar5;
    pfVar5 = tcu::Vector<float,_2>::operator[](dPdyFace,local_6c);
    *pfVar5 = ((fVar8 * fVar6 + -(fVar7 * fVar1)) * 0.5) / (fVar2 * fVar3);
  }
  return;
}

Assistant:

void calcCubemapFaceCoords (const Vec3& r,
							const Vec3& drdx,
							const Vec3& drdy,
							const int	faceNdx,
							Vec2&		coordFace,
							Vec2&		dPdxFace,
							Vec2&		dPdyFace)
{
	DE_ASSERT(faceNdx >= 0 && faceNdx < 6);

	static const int compMap[6][3] =
	{
		{2, 1, 0},
		{2, 1, 0},
		{0, 2, 1},
		{0, 2, 1},
		{0, 1, 2},
		{0, 1, 2}
	};

	static const int signMap[6][3] =
	{
		{-1, -1, +1},
		{+1, -1, -1},
		{+1, +1, +1},
		{+1, -1, -1},
		{+1, -1, +1},
		{-1, -1, -1}
	};

	Vec3 coordC;
	Vec3 dPcdx;
	Vec3 dPcdy;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int	mappedComp = compMap[faceNdx][compNdx];
		const int	mappedSign = signMap[faceNdx][compNdx];

		coordC[compNdx] = r   [mappedComp]	* (float)mappedSign;
		dPcdx [compNdx]	= drdx[mappedComp]	* (float)mappedSign;
		dPcdy [compNdx]	= drdy[mappedComp]	* (float)mappedSign;
	}

	DE_ASSERT(coordC[2] != 0.0f);
	coordC[2] = de::abs(coordC[2]);

	for (int compNdx = 0; compNdx < 2; ++compNdx)
	{
		coordFace[compNdx] = 0.5f * coordC[compNdx] / de::abs(coordC[2]) + 0.5f;

		dPdxFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdx[compNdx] - coordC[compNdx] * dPcdx[2]) / (coordC[2] * coordC[2]);
		dPdyFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdy[compNdx] - coordC[compNdx] * dPcdy[2]) / (coordC[2] * coordC[2]);
	}
}